

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O0

void list_vanquished(char defquery,boolean ask)

{
  boolean bVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  nh_menuitem *pnVar5;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  menulist menu;
  char buf [256];
  long lStack_28;
  char c;
  long total_killed;
  int nkilled;
  int max_lev;
  int ntypes;
  int lev;
  int i;
  boolean ask_local;
  char defquery_local;
  
  nkilled = 0;
  total_killed._4_4_ = 0;
  lStack_28 = 0;
  for (ntypes = 0; ntypes < 0x193; ntypes = ntypes + 1) {
    if (mvitals[ntypes].died != '\0') {
      nkilled = nkilled + 1;
    }
    lStack_28 = (ulong)mvitals[ntypes].died + lStack_28;
    if (total_killed._4_4_ < mons[ntypes].mlevel) {
      total_killed._4_4_ = (int)mons[ntypes].mlevel;
    }
  }
  if (nkilled != 0) {
    if (ask != '\0') {
      defquery = yn_function("Do you want an account of creatures vanquished?","ynq",defquery);
    }
    if (defquery == 'q') {
      program_state.stopprint = program_state.stopprint + 1;
    }
    if (defquery == 'y') {
      init_menulist((menulist *)&_item_);
      for (max_lev = total_killed._4_4_; -1 < max_lev; max_lev = max_lev + -1) {
        for (ntypes = 0; ntypes < 0x193; ntypes = ntypes + 1) {
          if ((mons[ntypes].mlevel == max_lev) && (uVar2 = (uint)mvitals[ntypes].died, uVar2 != 0))
          {
            if (((mons[ntypes].geno & 0x1000) == 0) || (ntypes == 0x120)) {
              if (uVar2 == 1) {
                pcVar3 = mons_mname(mons + ntypes);
                pcVar3 = an(pcVar3);
                strcpy((char *)&menu.size,pcVar3);
              }
              else {
                pcVar3 = mons_mname(mons + ntypes);
                pcVar3 = makeplural(pcVar3);
                sprintf((char *)&menu.size,"%d %s",(ulong)uVar2,pcVar3);
              }
            }
            else {
              pcVar3 = "";
              if ((mons[ntypes].mflags2 & 0x80000) == 0) {
                pcVar3 = "The ";
              }
              pcVar4 = mons_mname(mons + ntypes);
              sprintf((char *)&menu.size,"%s%s",pcVar3,pcVar4);
              if (1 < uVar2) {
                if (uVar2 == 2) {
                  pcVar3 = eos((char *)&menu.size);
                  sprintf(pcVar3," (twice)");
                }
                else if (uVar2 == 3) {
                  pcVar3 = eos((char *)&menu.size);
                  sprintf(pcVar3," (thrice)");
                }
                else {
                  pcVar3 = eos((char *)&menu.size);
                  pcVar4 = "s";
                  if (uVar2 == 1) {
                    pcVar4 = "";
                  }
                  sprintf(pcVar3," (%d time%s)",(ulong)uVar2,pcVar4);
                }
              }
            }
            if ((int)menu.items <= menu.items._4_4_) {
              menu.items._0_4_ = (int)menu.items << 1;
              _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
            }
            pnVar5 = _item_ + menu.items._4_4_;
            pnVar5->id = 0;
            pnVar5->role = MI_TEXT;
            pnVar5->accel = '\0';
            pnVar5->group_accel = '\0';
            pnVar5->selected = '\0';
            strcpy(pnVar5->caption,(char *)&menu.size);
            menu.items._4_4_ = menu.items._4_4_ + 1;
          }
        }
      }
      if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
         ((u.umonnum == u.umonster || (bVar1 = dmgtype(youmonst.data,0x24), bVar1 == '\0')))) {
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
        }
        pnVar5 = _item_ + menu.items._4_4_;
        pnVar5->id = 0;
        pnVar5->role = MI_TEXT;
        pnVar5->accel = '\0';
        pnVar5->group_accel = '\0';
        pnVar5->selected = '\0';
        strcpy(pnVar5->caption,"and a partridge in a pear tree");
        menu.items._4_4_ = menu.items._4_4_ + 1;
      }
      if (1 < nkilled) {
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
        }
        pnVar5 = _item_ + menu.items._4_4_;
        pnVar5->id = 0;
        pnVar5->role = MI_TEXT;
        pnVar5->accel = '\0';
        pnVar5->group_accel = '\0';
        pnVar5->selected = '\0';
        strcpy(pnVar5->caption,"");
        menu.items._4_4_ = menu.items._4_4_ + 1;
        sprintf((char *)&menu.size,"%ld creatures vanquished.",lStack_28);
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
        }
        pnVar5 = _item_ + menu.items._4_4_;
        pnVar5->id = 0;
        pnVar5->role = MI_TEXT;
        pnVar5->accel = '\0';
        pnVar5->group_accel = '\0';
        pnVar5->selected = '\0';
        strcpy(pnVar5->caption,(char *)&menu.size);
        menu.items._4_4_ = menu.items._4_4_ + 1;
      }
      display_menu(_item_,menu.items._4_4_,"Vanquished creatures:",0,(int *)0x0);
      free(_item_);
    }
  }
  return;
}

Assistant:

void list_vanquished(char defquery, boolean ask)
{
    int i, lev;
    int ntypes = 0, max_lev = 0, nkilled;
    long total_killed = 0L;
    char c;
    char buf[BUFSZ];
    struct menulist menu;

    /* get totals first */
    for (i = LOW_PM; i < NUMMONS; i++) {
	if (mvitals[i].died) ntypes++;
	total_killed += (long)mvitals[i].died;
	if (mons[i].mlevel > max_lev) max_lev = mons[i].mlevel;
    }

    /* vanquished creatures list;
     * includes all dead monsters, not just those killed by the player
     */
    if (ntypes != 0) {
	c = ask ? yn_function("Do you want an account of creatures vanquished?",
			      ynqchars, defquery) : defquery;
	if (c == 'q') done_stopprint++;
	if (c == 'y') {
	    init_menulist(&menu);

	    /* countdown by monster "toughness" */
	    for (lev = max_lev; lev >= 0; lev--)
	      for (i = LOW_PM; i < NUMMONS; i++)
		if (mons[i].mlevel == lev && (nkilled = mvitals[i].died) > 0) {
		    if ((mons[i].geno & G_UNIQ) && i != PM_HIGH_PRIEST) {
			sprintf(buf, "%s%s",
				!type_is_pname(&mons[i]) ? "The " : "",
				mons_mname(&mons[i]));
			if (nkilled > 1) {
			    switch (nkilled) {
				case 2:  sprintf(eos(buf)," (twice)");  break;
				case 3:  sprintf(eos(buf)," (thrice)");  break;
				default: sprintf(eos(buf)," (%d time%s)",
						 nkilled, plur(nkilled));
					 break;
			    }
			}
		    } else {
			/* trolls or undead might have come back,
			   but we don't keep track of that */
			if (nkilled == 1)
			    strcpy(buf, an(mons_mname(&mons[i])));
			else
			    sprintf(buf, "%d %s",
				    nkilled, makeplural(mons_mname(&mons[i])));
		    }
		    add_menutext(&menu,  buf);
		}

	    if (Hallucination)
		add_menutext(&menu, "and a partridge in a pear tree");

	    if (ntypes > 1) {
		add_menutext(&menu,  "");
		sprintf(buf, "%ld creatures vanquished.", total_killed);
		add_menutext(&menu,  buf);
	    }
	    display_menu(menu.items, menu.icount, "Vanquished creatures:", PICK_NONE, NULL);
	    free(menu.items);
	}
    }
}